

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O1

void __thiscall xray_re::xr_bone::load_1(xr_bone *this,xr_reader *r)

{
  fvector3 *pfVar1;
  float *pfVar2;
  undefined8 in_RAX;
  size_t sVar3;
  uint16_t version;
  short local_12;
  
  local_12 = (short)((ulong)in_RAX >> 0x30);
  sVar3 = xr_reader::r_raw_chunk(r,1,&local_12,2);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                  ,0x19,"void xray_re::xr_bone::load_1(xr_reader &)");
  }
  if (1 < (ushort)(local_12 - 1U)) {
    __assert_fail("version == BONE_VERSION_1 || version == BONE_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                  ,0x1a,"void xray_re::xr_bone::load_1(xr_reader &)");
  }
  sVar3 = xr_reader::find_chunk(r,2);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                  ,0x1d,"void xray_re::xr_bone::load_1(xr_reader &)");
  }
  xr_reader::r_sz(r,&this->m_name);
  xr_reader::r_sz(r,&this->m_parent_name);
  xr_reader::r_sz(r,&this->m_vmap_name);
  sVar3 = xr_reader::find_chunk(r,3);
  if (sVar3 != 0) {
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_bind_offset).field_0.field_0.x = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_bind_offset).field_0.field_0.y = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_bind_offset).field_0.field_0.z = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_bind_rotate).field_0.field_0.x = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_bind_rotate).field_0.field_0.y = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_bind_rotate).field_0.field_0.z = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    this->m_bind_length = *pfVar2;
    if (local_12 == 1) {
      pfVar1 = &this->m_bind_offset;
      *(ulong *)&pfVar1->field_0 =
           *(long *)&pfVar1->field_0 << 0x20 | *(ulong *)&pfVar1->field_0 >> 0x20;
    }
    load_data(this,r);
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                ,0x24,"void xray_re::xr_bone::load_1(xr_reader &)");
}

Assistant:

void xr_bone::load_1(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(BONE_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == BONE_VERSION_1 || version == BONE_VERSION);

	if (!r.find_chunk(BONE_CHUNK_DEF))
		xr_not_expected();
	r.r_sz(m_name);
	r.r_sz(m_parent_name);
	r.r_sz(m_vmap_name);
	r.debug_find_chunk();

	if (!r.find_chunk(BONE_CHUNK_BIND_POSE))
		xr_not_expected();
	r.r_fvector3(m_bind_offset);
	r.r_fvector3(m_bind_rotate);
	m_bind_length = r.r_float();
	r.debug_find_chunk();
	if (version == BONE_VERSION_1)
		std::swap(m_bind_offset.x, m_bind_offset.y);

	load_data(r);
}